

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Attribute_PDU.cpp
# Opt level: O1

void __thiscall KDIS::PDU::Attribute_PDU::Encode(Attribute_PDU *this,KDataStream *stream)

{
  pointer pAVar1;
  pointer pAVar2;
  
  Header7::Encode(&this->super_Header,stream);
  (*(this->m_OrigSimAddr).super_DataTypeBase._vptr_DataTypeBase[5])(&this->m_OrigSimAddr,stream);
  KDataStream::Write<unsigned_int>(stream,this->m_ui32Padding);
  KDataStream::Write<unsigned_short>(stream,this->m_ui16Padding);
  KDataStream::Write(stream,this->m_ui8ExtPDUType);
  KDataStream::Write(stream,this->m_ui8ExtProtocolVersion);
  KDataStream::Write<unsigned_int>(stream,this->m_ui32MasterRecType);
  KDataStream::Write(stream,this->m_ui8ActionCode);
  KDataStream::Write(stream,this->m_ui8Padding1);
  KDataStream::Write<unsigned_short>(stream,this->m_ui16NumAttrRecSets);
  pAVar1 = (this->m_vAttributeRecordSets).
           super__Vector_base<KDIS::DATA_TYPE::AttributeRecordSet,_std::allocator<KDIS::DATA_TYPE::AttributeRecordSet>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pAVar2 = (this->m_vAttributeRecordSets).
                super__Vector_base<KDIS::DATA_TYPE::AttributeRecordSet,_std::allocator<KDIS::DATA_TYPE::AttributeRecordSet>_>
                ._M_impl.super__Vector_impl_data._M_start; pAVar2 != pAVar1; pAVar2 = pAVar2 + 1) {
    (*(pAVar2->super_DataTypeBase)._vptr_DataTypeBase[5])(pAVar2,stream);
  }
  return;
}

Assistant:

void Attribute_PDU::Encode( KDataStream & stream ) const
{
    Header::Encode( stream );

    stream << KDIS_STREAM m_OrigSimAddr
           << m_ui32Padding
           << m_ui16Padding
           << m_ui8ExtPDUType
           << m_ui8ExtProtocolVersion
           << m_ui32MasterRecType
           << m_ui8ActionCode
           << m_ui8Padding1
           << m_ui16NumAttrRecSets;

    vector<AttributeRecordSet>::const_iterator citr = m_vAttributeRecordSets.begin();
    vector<AttributeRecordSet>::const_iterator citrEnd = m_vAttributeRecordSets.end();
    for( ; citr != citrEnd; ++citr )
    {
        citr->Encode( stream );
    }		
}